

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::setTex3DBinding(ReferenceContext *this,int unitNdx,Texture3D *texture)

{
  reference pvVar1;
  Texture3D *texture_local;
  int unitNdx_local;
  ReferenceContext *this_local;
  
  pvVar1 = std::
           vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ::operator[](&this->m_textureUnits,(long)unitNdx);
  if (pvVar1->tex3DBinding != (Texture3D *)0x0) {
    pvVar1 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)unitNdx);
    rc::ObjectManager<sglr::rc::Texture>::releaseReference
              (&this->m_textures,&pvVar1->tex3DBinding->super_Texture);
    pvVar1 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)unitNdx);
    pvVar1->tex3DBinding = (Texture3D *)0x0;
  }
  if (texture != (Texture3D *)0x0) {
    rc::ObjectManager<sglr::rc::Texture>::acquireReference
              (&this->m_textures,&texture->super_Texture);
    pvVar1 = std::
             vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ::operator[](&this->m_textureUnits,(long)unitNdx);
    pvVar1->tex3DBinding = texture;
  }
  return;
}

Assistant:

void ReferenceContext::setTex3DBinding (int unitNdx, Texture3D* texture)
{
	if (m_textureUnits[unitNdx].tex3DBinding)
	{
		m_textures.releaseReference(m_textureUnits[unitNdx].tex3DBinding);
		m_textureUnits[unitNdx].tex3DBinding = DE_NULL;
	}

	if (texture)
	{
		m_textures.acquireReference(texture);
		m_textureUnits[unitNdx].tex3DBinding = texture;
	}
}